

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom_tests.cpp
# Opt level: O2

void __thiscall
bloom_tests::merkle_block_2_with_update_none::test_method(merkle_block_2_with_update_none *this)

{
  long lVar1;
  readonly_property<bool> rVar2;
  readonly_property65 rVar3;
  bool bVar4;
  uint uVar5;
  ulong uVar6;
  iterator in_R8;
  iterator pvVar7;
  iterator in_R9;
  iterator pvVar8;
  long in_FS_OFFSET;
  Span<const_std::byte> sp;
  Span<const_unsigned_char> vKey;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  Span<const_unsigned_char> vKey_00;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  check_type cVar9;
  undefined1 *local_b10;
  undefined1 *local_b08;
  char *local_b00;
  char *local_af8;
  char *local_af0;
  char *local_ae8;
  undefined1 *local_ae0;
  undefined1 *local_ad8;
  char *local_ad0;
  char *local_ac8;
  char *local_ac0;
  char *local_ab8;
  undefined1 *local_ab0;
  undefined1 *local_aa8;
  char *local_aa0;
  char *local_a98;
  char *local_a90;
  char *local_a88;
  undefined1 *local_a80;
  undefined1 *local_a78;
  char *local_a70;
  char *local_a68;
  char *local_a60;
  char *local_a58;
  undefined1 *local_a50;
  undefined1 *local_a48;
  char *local_a40;
  char *local_a38;
  char *local_a30;
  char *local_a28;
  undefined1 *local_a20;
  undefined1 *local_a18;
  char *local_a10;
  char *local_a08;
  char *local_a00;
  char *local_9f8;
  undefined1 *local_9f0;
  undefined1 *local_9e8;
  char *local_9e0;
  char *local_9d8;
  char *local_9d0;
  char *local_9c8;
  undefined1 *local_9c0;
  undefined1 *local_9b8;
  char *local_9b0;
  char *local_9a8;
  char *local_9a0;
  char *local_998;
  undefined1 *local_990;
  undefined1 *local_988;
  char *local_980;
  char *local_978;
  char *local_970;
  char *local_968;
  char *local_960;
  char *local_958;
  assertion_result local_950;
  char **local_938;
  assertion_result local_930;
  undefined1 *local_918;
  undefined1 *local_910;
  char *local_908;
  char *local_900;
  char *local_8f8;
  char *local_8f0;
  undefined1 *local_8e8;
  undefined1 *local_8e0;
  char *local_8d8;
  char *local_8d0;
  char *local_8c8;
  char *local_8c0;
  undefined1 *local_8b8;
  undefined1 *local_8b0;
  char *local_8a8;
  char *local_8a0;
  char *local_898;
  char *local_890;
  undefined1 *local_888;
  undefined1 *local_880;
  char *local_878;
  char *local_870;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vIndex;
  vector<uint256,_std::allocator<uint256>_> vMatched;
  char *local_830;
  char *local_828;
  undefined1 *local_820;
  undefined1 *local_818;
  char *local_810;
  char *local_808;
  char *local_800;
  char *local_7f8;
  undefined1 *local_7f0;
  undefined1 *local_7e8;
  char *local_7e0;
  char *local_7d8;
  char *local_7d0;
  char *local_7c8;
  undefined1 *local_7c0;
  undefined1 *local_7b8;
  char *local_7b0;
  char *local_7a8;
  char *local_7a0;
  char *local_798;
  undefined1 *local_790;
  undefined1 *local_788;
  char *local_780;
  char *local_778;
  DataStream stream;
  CBloomFilter filter;
  undefined1 local_728 [16];
  undefined8 local_718;
  assertion_result *apaStack_710 [21];
  pair<unsigned_int,_uint256> pair;
  undefined1 local_638 [8];
  element_type *local_630;
  shared_count sStack_628;
  assertion_result *local_620;
  CMerkleBlock merkleBlock;
  CBlock block;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CBlock::CBlock(&block);
  memcpy(&merkleBlock,null_ARRAY_00b7c810,0x569);
  sp.m_size = 0x569;
  sp.m_data = (byte *)&merkleBlock;
  DataStream::DataStream(&stream,sp);
  merkleBlock.header._0_8_ = &::TX_WITH_WITNESS;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._4_8_ = &block;
  ParamsWrapper<TransactionSerParams,_CBlock>::Unserialize<DataStream>
            ((ParamsWrapper<TransactionSerParams,_CBlock> *)&merkleBlock,&stream);
  CBloomFilter::CBloomFilter(&filter,10,1e-06,0,'\0');
  merkleBlock.header.nVersion = -0x1346c490;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] = 'z';
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] = 0xb4;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] = 0xf5;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] = 'm';
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = 0x9e;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = 'A';
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = 'z';
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = 'S';
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = 0xac;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = '\x19';
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = 0xce;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = 0xf9;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = 0xc5;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = '5';
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = '\x13';
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = 0xdc;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] = '\x03';
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] = 'R';
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] = 0xb9;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] = 's';
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x14] = 'N';
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x15] = '\x01';
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x16] = '-';
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x17] = 'y';
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x18] = 0x9f;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x19] = 0xfe;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1a] = 0x80;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1b] = 0xe9;
  vKey.m_size = 0x20;
  vKey.m_data = (uchar *)&merkleBlock;
  CBloomFilter::insert(&filter,vKey);
  CMerkleBlock::CMerkleBlock(&merkleBlock,&block,&filter);
  local_780 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_778 = "";
  local_790 = &boost::unit_test::basic_cstring<char_const>::null;
  local_788 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x11e;
  file.m_begin = (iterator)&local_780;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_790,msg);
  CBlockHeader::GetHash((uint256 *)local_728,&merkleBlock.header);
  CBlockHeader::GetHash((uint256 *)&pair,&block.super_CBlockHeader);
  rVar2.super_class_property<bool>.value =
       (class_property<bool>)::operator==((base_blob<256U> *)local_728,(base_blob<256U> *)&pair);
  local_950.m_message.px = (element_type *)0x0;
  local_950.m_message.pn.pi_ = (sp_counted_base *)0x0;
  vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_3ca81c;
  vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xb7bab9;
  local_630 = (element_type *)((ulong)local_630 & 0xffffffffffffff00);
  local_638 = (undefined1  [8])&PTR__lazy_ostream_011481f0;
  sStack_628.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_7a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_798 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  local_620 = (assertion_result *)&vMatched;
  local_950.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar2.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            (&local_950,(lazy_ostream *)local_638,1,0,WARN,_cVar9,(size_t)&local_7a0,0x11e);
  boost::detail::shared_count::~shared_count(&local_950.m_message.pn);
  local_7b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_7a8 = "";
  local_7c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x120;
  file_00.m_begin = (iterator)&local_7b0;
  msg_00.m_end = pvVar8;
  msg_00.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_7c0,
             msg_00);
  pair.first._0_1_ =
       (long)merkleBlock.vMatchedTxn.
             super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)merkleBlock.vMatchedTxn.
             super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
             ._M_impl.super__Vector_impl_data._M_start == 0x24;
  pair.second.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  pair.second.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  pair.second.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  pair.second.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  pair.second.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  pair.second.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  pair.second.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  pair.second.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  pair.second.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  pair.second.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  pair.second.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  pair.second.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  pair.second.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  pair.second.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  pair.second.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  pair.second.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  local_638 = (undefined1  [8])0xb7bba7;
  local_630 = (element_type *)0xb7bbca;
  local_728._8_8_ = local_728._8_8_ & 0xffffffffffffff00;
  local_728._0_8_ = &PTR__lazy_ostream_011481f0;
  local_718 = boost::unit_test::lazy_ostream::inst;
  local_7d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_7c8 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  apaStack_710[0] = (assertion_result *)local_638;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&pair,(lazy_ostream *)local_728,1,0,WARN,_cVar9,(size_t)&local_7d0,
             0x120);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(pair.second.super_base_blob<256U>.m_data._M_elems + 0xc));
  pair.first = (merkleBlock.vMatchedTxn.
                super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->first;
  pair.second.super_base_blob<256U>.m_data._M_elems[0] =
       ((merkleBlock.vMatchedTxn.
         super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data._M_elems
       [0];
  pair.second.super_base_blob<256U>.m_data._M_elems[1] =
       ((merkleBlock.vMatchedTxn.
         super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data._M_elems
       [1];
  pair.second.super_base_blob<256U>.m_data._M_elems[2] =
       ((merkleBlock.vMatchedTxn.
         super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data._M_elems
       [2];
  pair.second.super_base_blob<256U>.m_data._M_elems[3] =
       ((merkleBlock.vMatchedTxn.
         super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data._M_elems
       [3];
  pair.second.super_base_blob<256U>.m_data._M_elems._4_8_ =
       *(undefined8 *)
        (((merkleBlock.vMatchedTxn.
           super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data._M_elems
        + 4);
  pair.second.super_base_blob<256U>.m_data._M_elems._12_8_ =
       *(undefined8 *)
        (((merkleBlock.vMatchedTxn.
           super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data._M_elems
        + 0xc);
  pair.second.super_base_blob<256U>.m_data._M_elems._20_8_ =
       *(undefined8 *)
        (((merkleBlock.vMatchedTxn.
           super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data._M_elems
        + 0x14);
  pair.second.super_base_blob<256U>.m_data._M_elems._28_4_ =
       *(undefined4 *)
        (((merkleBlock.vMatchedTxn.
           super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data._M_elems
        + 0x1c);
  local_7e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_7d8 = "";
  local_7f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x123;
  file_01.m_begin = (iterator)&local_7e0;
  msg_01.m_end = pvVar8;
  msg_01.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_7f0,
             msg_01);
  local_728._0_8_ = (_func_int **)0x6df5b47aecb93b70;
  local_728._8_8_ = 0xf9ce19ac537a419e;
  local_718._0_1_ = 0xc5;
  local_718._1_1_ = '5';
  local_718._2_1_ = '\x13';
  local_718._3_1_ = 0xdc;
  local_718._4_1_ = '\x03';
  local_718._5_1_ = 'R';
  local_718._6_1_ = 0xb9;
  local_718._7_1_ = 's';
  apaStack_710[0] = (assertion_result *)0xe980fe9f792d014e;
  local_950.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ::operator==(&((merkleBlock.vMatchedTxn.
                       super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>,
                    (base_blob<256U> *)local_728);
  local_950.m_message.px = (element_type *)0x0;
  local_950.m_message.pn.pi_ = (sp_counted_base *)0x0;
  vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_3ca885;
  vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xb7bc3b;
  local_630 = (element_type *)((ulong)local_630 & 0xffffffffffffff00);
  local_638 = (undefined1  [8])&PTR__lazy_ostream_011481f0;
  sStack_628.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_800 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_7f8 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  local_620 = (assertion_result *)&vMatched;
  boost::test_tools::tt_detail::report_assertion
            (&local_950,(lazy_ostream *)local_638,1,0,WARN,_cVar9,(size_t)&local_800,0x123);
  boost::detail::shared_count::~shared_count(&local_950.m_message.pn);
  local_810 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_808 = "";
  local_820 = &boost::unit_test::basic_cstring<char_const>::null;
  local_818 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x124;
  file_02.m_begin = (iterator)&local_810;
  msg_02.m_end = pvVar8;
  msg_02.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_820,
             msg_02);
  local_638[0] = (class_property<bool>)
                 (class_property<bool>)
                 ((merkleBlock.vMatchedTxn.
                   super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->first == 0);
  local_630 = (element_type *)0x0;
  sStack_628.pi_ = (sp_counted_base *)0x0;
  local_950._0_8_ = "merkleBlock.vMatchedTxn[0].first == 0";
  local_950.m_message.px = (element_type *)0xb7bc61;
  local_728._8_8_ = local_728._8_8_ & 0xffffffffffffff00;
  local_728._0_8_ = &PTR__lazy_ostream_011481f0;
  local_718 = boost::unit_test::lazy_ostream::inst;
  local_830 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_828 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  apaStack_710[0] = &local_950;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_638,(lazy_ostream *)local_728,1,0,WARN,_cVar9,
             (size_t)&local_830,0x124);
  boost::detail::shared_count::~shared_count(&sStack_628);
  vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  vIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_878 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_870 = "";
  local_888 = &boost::unit_test::basic_cstring<char_const>::null;
  local_880 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x128;
  file_03.m_begin = (iterator)&local_878;
  msg_03.m_end = pvVar8;
  msg_03.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_888,
             msg_03);
  CPartialMerkleTree::ExtractMatches((uint256 *)local_728,&merkleBlock.txn,&vMatched,&vIndex);
  rVar3.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ::operator==((base_blob<256U> *)local_728,
                    &block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>);
  local_950.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       rVar3.super_readonly_property<bool>.super_class_property<bool>.value;
  local_950.m_message.px = (element_type *)0x0;
  local_950.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_620 = &local_930;
  local_930._0_8_ = "merkleBlock.txn.ExtractMatches(vMatched, vIndex) == block.hashMerkleRoot";
  local_930.m_message.px = (element_type *)0xb7ba26;
  local_630 = (element_type *)((ulong)local_630 & 0xffffffffffffff00);
  local_638 = (undefined1  [8])&PTR__lazy_ostream_011481f0;
  sStack_628.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_898 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_890 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_950,(lazy_ostream *)local_638,1,0,WARN,_cVar9,(size_t)&local_898,0x128);
  boost::detail::shared_count::~shared_count(&local_950.m_message.pn);
  local_8a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_8a0 = "";
  local_8b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x129;
  file_04.m_begin = (iterator)&local_8a8;
  msg_04.m_end = pvVar8;
  msg_04.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_8b8,
             msg_04);
  local_638[0] = (class_property<bool>)
                 (class_property<bool>)
                 ((long)vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_start >> 5 ==
                 ((long)merkleBlock.vMatchedTxn.
                        super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)merkleBlock.vMatchedTxn.
                       super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x24);
  local_630 = (element_type *)0x0;
  sStack_628.pi_ = (sp_counted_base *)0x0;
  local_950._0_8_ = "vMatched.size() == merkleBlock.vMatchedTxn.size()";
  local_950.m_message.px = (element_type *)0xb7ba58;
  local_728._8_8_ = local_728._8_8_ & 0xffffffffffffff00;
  local_728._0_8_ = &PTR__lazy_ostream_011481f0;
  local_718 = boost::unit_test::lazy_ostream::inst;
  apaStack_710[0] = &local_950;
  local_8c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_8c0 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_638,(lazy_ostream *)local_728,1,0,WARN,_cVar9,
             (size_t)&local_8c8,0x129);
  boost::detail::shared_count::~shared_count(&sStack_628);
  for (uVar5 = 0; uVar6 = (ulong)uVar5,
      uVar6 < (ulong)((long)vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_start >> 5); uVar5 = uVar5 + 1) {
    local_8d8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
    local_8d0 = "";
    local_8e8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_8e0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_05.m_end = (iterator)0x12b;
    file_05.m_begin = (iterator)&local_8d8;
    msg_05.m_end = pvVar8;
    msg_05.m_begin = pvVar7;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_8e8,
               msg_05);
    bVar4 = ::operator==(&vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar6].super_base_blob<256U>,
                         &merkleBlock.vMatchedTxn.
                          super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar6].second.
                          super_base_blob<256U>);
    local_638[0] = (class_property<bool>)(class_property<bool>)bVar4;
    local_630 = (element_type *)0x0;
    sStack_628.pi_ = (sp_counted_base *)0x0;
    local_950._0_8_ = "vMatched[i] == merkleBlock.vMatchedTxn[i].second";
    local_950.m_message.px = (element_type *)0xb7ba89;
    local_728._8_8_ = local_728._8_8_ & 0xffffffffffffff00;
    local_728._0_8_ = &PTR__lazy_ostream_011481f0;
    local_718 = boost::unit_test::lazy_ostream::inst;
    apaStack_710[0] = &local_950;
    local_8f8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
    local_8f0 = "";
    pvVar7 = &DAT_00000001;
    pvVar8 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_638,(lazy_ostream *)local_728,1,0,WARN,_cVar9,
               (size_t)&local_8f8,299);
    boost::detail::shared_count::~shared_count(&sStack_628);
  }
  memcpy(local_728,util::hex_literals::detail::Hex<131ul>{std::array<std::byte_65ul>,0x41);
  vKey_00.m_size = 0x41;
  vKey_00.m_data = local_728;
  CBloomFilter::insert(&filter,vKey_00);
  CMerkleBlock::CMerkleBlock((CMerkleBlock *)local_728,&block,&filter);
  CMerkleBlock::operator=(&merkleBlock,(CMerkleBlock *)local_728);
  CMerkleBlock::~CMerkleBlock((CMerkleBlock *)local_728);
  local_908 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_900 = "";
  local_918 = &boost::unit_test::basic_cstring<char_const>::null;
  local_910 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x133;
  file_06.m_begin = (iterator)&local_908;
  msg_06.m_end = pvVar8;
  msg_06.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_918,
             msg_06);
  CBlockHeader::GetHash((uint256 *)local_728,&merkleBlock.header);
  CBlockHeader::GetHash((uint256 *)local_638,&block.super_CBlockHeader);
  bVar4 = ::operator==((base_blob<256U> *)local_728,(base_blob<256U> *)local_638);
  local_930.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar4;
  local_930.m_message.px = (element_type *)0x0;
  local_930.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_938 = &local_960;
  local_960 = "merkleBlock.header.GetHash() == block.GetHash()";
  local_958 = "";
  local_950.m_message.px = (element_type *)((ulong)local_950.m_message.px & 0xffffffffffffff00);
  local_950._0_8_ = &PTR__lazy_ostream_011481f0;
  local_950.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_970 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_968 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_930,(lazy_ostream *)&local_950,1,0,WARN,_cVar9,(size_t)&local_970,0x133);
  boost::detail::shared_count::~shared_count(&local_930.m_message.pn);
  local_980 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_978 = "";
  local_990 = &boost::unit_test::basic_cstring<char_const>::null;
  local_988 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x135;
  file_07.m_begin = (iterator)&local_980;
  msg_07.m_end = pvVar8;
  msg_07.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_990,
             msg_07);
  local_630 = (element_type *)0x0;
  sStack_628.pi_ = (sp_counted_base *)0x0;
  local_950._0_8_ = "merkleBlock.vMatchedTxn.size() == 3";
  local_950.m_message.px = (element_type *)0xb7beb1;
  local_728._8_8_ = local_728._8_8_ & 0xffffffffffffff00;
  local_728._0_8_ = &PTR__lazy_ostream_011481f0;
  local_718 = boost::unit_test::lazy_ostream::inst;
  local_9a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_998 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  apaStack_710[0] = &local_950;
  local_638[0] = (class_property<bool>)
                 (class_property<bool>)
                 ((long)merkleBlock.vMatchedTxn.
                        super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)merkleBlock.vMatchedTxn.
                        super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                        ._M_impl.super__Vector_impl_data._M_start == 0x6c);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_638,(lazy_ostream *)local_728,1,0,WARN,_cVar9,
             (size_t)&local_9a0,0x135);
  boost::detail::shared_count::~shared_count(&sStack_628);
  local_9b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_9a8 = "";
  local_9c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x137;
  file_08.m_begin = (iterator)&local_9b0;
  msg_08.m_end = pvVar8;
  msg_08.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_9c0,
             msg_08);
  local_638[0] = (class_property<bool>)
                 std::operator==(&pair,merkleBlock.vMatchedTxn.
                                       super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start);
  local_630 = (element_type *)0x0;
  sStack_628.pi_ = (sp_counted_base *)0x0;
  local_950._0_8_ = "pair == merkleBlock.vMatchedTxn[0]";
  local_950.m_message.px = (element_type *)0xb7bca8;
  local_728._8_8_ = local_728._8_8_ & 0xffffffffffffff00;
  local_728._0_8_ = &PTR__lazy_ostream_011481f0;
  local_718 = boost::unit_test::lazy_ostream::inst;
  local_9d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_9c8 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  apaStack_710[0] = &local_950;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_638,(lazy_ostream *)local_728,1,0,WARN,_cVar9,
             (size_t)&local_9d0,0x137);
  boost::detail::shared_count::~shared_count(&sStack_628);
  local_9e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_9d8 = "";
  local_9f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x139;
  file_09.m_begin = (iterator)&local_9e0;
  msg_09.m_end = pvVar8;
  msg_09.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_9f0,
             msg_09);
  local_728._0_8_ = (_func_int **)0x56ebdcacd3069a5f;
  local_728._8_8_ = 0xe6258a3eaafe1bbe;
  local_718._0_1_ = '-';
  local_718._1_1_ = '\x18';
  local_718._2_1_ = '/';
  local_718._3_1_ = 0xa2;
  local_718._4_1_ = 'O';
  local_718._5_1_ = 0xef;
  local_718._6_1_ = 0xe8;
  local_718._7_1_ = 0x99;
  apaStack_710[0] = (assertion_result *)0x28204cad1d7fc1d1;
  rVar3.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ::operator==(&merkleBlock.vMatchedTxn.
                     super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[1].second.super_base_blob<256U>,
                    (base_blob<256U> *)local_728);
  local_950.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       rVar3.super_readonly_property<bool>.super_class_property<bool>.value;
  local_950.m_message.px = (element_type *)0x0;
  local_950.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_930._0_8_ =
       "merkleBlock.vMatchedTxn[1].second == uint256{\"28204cad1d7fc1d199e8ef4fa22f182de6258a3eaafe1bbe56ebdcacd3069a5f\"}"
  ;
  local_930.m_message.px = (element_type *)0xb7bd19;
  local_630 = (element_type *)((ulong)local_630 & 0xffffffffffffff00);
  local_638 = (undefined1  [8])&PTR__lazy_ostream_011481f0;
  sStack_628.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_a00 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_9f8 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  local_620 = &local_930;
  boost::test_tools::tt_detail::report_assertion
            (&local_950,(lazy_ostream *)local_638,1,0,WARN,_cVar9,(size_t)&local_a00,0x139);
  boost::detail::shared_count::~shared_count(&local_950.m_message.pn);
  local_a10 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_a08 = "";
  local_a20 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a18 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x13a;
  file_10.m_begin = (iterator)&local_a10;
  msg_10.m_end = pvVar8;
  msg_10.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_a20,
             msg_10);
  local_638[0] = (class_property<bool>)
                 (class_property<bool>)
                 (merkleBlock.vMatchedTxn.
                  super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[1].first == 1);
  local_630 = (element_type *)0x0;
  sStack_628.pi_ = (sp_counted_base *)0x0;
  local_950._0_8_ = "merkleBlock.vMatchedTxn[1].first == 1";
  local_950.m_message.px = (element_type *)0xb7bd3f;
  local_728._8_8_ = local_728._8_8_ & 0xffffffffffffff00;
  local_728._0_8_ = &PTR__lazy_ostream_011481f0;
  local_718 = boost::unit_test::lazy_ostream::inst;
  local_a30 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_a28 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  apaStack_710[0] = &local_950;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_638,(lazy_ostream *)local_728,1,0,WARN,_cVar9,
             (size_t)&local_a30,0x13a);
  boost::detail::shared_count::~shared_count(&sStack_628);
  local_a40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_a38 = "";
  local_a50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a48 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x13c;
  file_11.m_begin = (iterator)&local_a40;
  msg_11.m_end = pvVar8;
  msg_11.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_a50,
             msg_11);
  local_728._0_8_ = (_func_int **)0x7663ace63cddb23;
  local_728._8_8_ = 0x84e403d8b4046d70;
  local_718._0_1_ = 'n';
  local_718._1_1_ = 0x8b;
  local_718._2_1_ = '4';
  local_718._3_1_ = 0xb6;
  local_718._4_1_ = 0xe0;
  local_718._5_1_ = 0xf2;
  local_718._6_1_ = 0x9d;
  local_718._7_1_ = '\x10';
  apaStack_710[0] = (assertion_result *)0x3c1d7e82342158e4;
  rVar3.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ::operator==(&merkleBlock.vMatchedTxn.
                     super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[2].second.super_base_blob<256U>,
                    (base_blob<256U> *)local_728);
  local_950.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       rVar3.super_readonly_property<bool>.super_class_property<bool>.value;
  local_950.m_message.px = (element_type *)0x0;
  local_950.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_930._0_8_ =
       "merkleBlock.vMatchedTxn[2].second == uint256{\"3c1d7e82342158e4109df2e0b6348b6e84e403d8b4046d7007663ace63cddb23\"}"
  ;
  local_930.m_message.px = (element_type *)0xb7bf22;
  local_630 = (element_type *)((ulong)local_630 & 0xffffffffffffff00);
  local_638 = (undefined1  [8])&PTR__lazy_ostream_011481f0;
  sStack_628.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_a60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_a58 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  local_620 = &local_930;
  boost::test_tools::tt_detail::report_assertion
            (&local_950,(lazy_ostream *)local_638,1,0,WARN,_cVar9,(size_t)&local_a60,0x13c);
  boost::detail::shared_count::~shared_count(&local_950.m_message.pn);
  local_a70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_a68 = "";
  local_a80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a78 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x13d;
  file_12.m_begin = (iterator)&local_a70;
  msg_12.m_end = pvVar8;
  msg_12.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_a80,
             msg_12);
  local_638[0] = (class_property<bool>)
                 (class_property<bool>)
                 (merkleBlock.vMatchedTxn.
                  super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[2].first == 3);
  local_630 = (element_type *)0x0;
  sStack_628.pi_ = (sp_counted_base *)0x0;
  local_950._0_8_ = "merkleBlock.vMatchedTxn[2].first == 3";
  local_950.m_message.px = (element_type *)0xb7bf48;
  local_728._8_8_ = local_728._8_8_ & 0xffffffffffffff00;
  local_728._0_8_ = &PTR__lazy_ostream_011481f0;
  local_718 = boost::unit_test::lazy_ostream::inst;
  local_a90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_a88 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  apaStack_710[0] = &local_950;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_638,(lazy_ostream *)local_728,1,0,WARN,_cVar9,
             (size_t)&local_a90,0x13d);
  boost::detail::shared_count::~shared_count(&sStack_628);
  local_aa0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_a98 = "";
  local_ab0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_aa8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x13f;
  file_13.m_begin = (iterator)&local_aa0;
  msg_13.m_end = pvVar8;
  msg_13.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_ab0,
             msg_13);
  CPartialMerkleTree::ExtractMatches((uint256 *)local_728,&merkleBlock.txn,&vMatched,&vIndex);
  rVar3.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ::operator==((base_blob<256U> *)local_728,
                    &block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>);
  local_950.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       rVar3.super_readonly_property<bool>.super_class_property<bool>.value;
  local_950.m_message.px = (element_type *)0x0;
  local_950.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_930._0_8_ = "merkleBlock.txn.ExtractMatches(vMatched, vIndex) == block.hashMerkleRoot";
  local_930.m_message.px = (element_type *)0xb7ba26;
  local_630 = (element_type *)((ulong)local_630 & 0xffffffffffffff00);
  local_638 = (undefined1  [8])&PTR__lazy_ostream_011481f0;
  sStack_628.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_ac0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_ab8 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  local_620 = &local_930;
  boost::test_tools::tt_detail::report_assertion
            (&local_950,(lazy_ostream *)local_638,1,0,WARN,_cVar9,(size_t)&local_ac0,0x13f);
  boost::detail::shared_count::~shared_count(&local_950.m_message.pn);
  local_ad0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_ac8 = "";
  local_ae0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_ad8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0x140;
  file_14.m_begin = (iterator)&local_ad0;
  msg_14.m_end = pvVar8;
  msg_14.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_ae0,
             msg_14);
  local_638[0] = (class_property<bool>)
                 (class_property<bool>)
                 ((long)vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_start >> 5 ==
                 ((long)merkleBlock.vMatchedTxn.
                        super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)merkleBlock.vMatchedTxn.
                       super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x24);
  local_630 = (element_type *)0x0;
  sStack_628.pi_ = (sp_counted_base *)0x0;
  local_950._0_8_ = "vMatched.size() == merkleBlock.vMatchedTxn.size()";
  local_950.m_message.px = (element_type *)0xb7ba58;
  local_728._8_8_ = local_728._8_8_ & 0xffffffffffffff00;
  local_728._0_8_ = &PTR__lazy_ostream_011481f0;
  local_718 = boost::unit_test::lazy_ostream::inst;
  apaStack_710[0] = &local_950;
  local_af0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_ae8 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_638,(lazy_ostream *)local_728,1,0,WARN,_cVar9,
             (size_t)&local_af0,0x140);
  boost::detail::shared_count::~shared_count(&sStack_628);
  for (uVar5 = 0; uVar6 = (ulong)uVar5,
      uVar6 < (ulong)((long)vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_start >> 5); uVar5 = uVar5 + 1) {
    local_b00 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
    local_af8 = "";
    local_b10 = &boost::unit_test::basic_cstring<char_const>::null;
    local_b08 = &boost::unit_test::basic_cstring<char_const>::null;
    file_15.m_end = (iterator)0x142;
    file_15.m_begin = (iterator)&local_b00;
    msg_15.m_end = pvVar8;
    msg_15.m_begin = pvVar7;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_b10,
               msg_15);
    bVar4 = ::operator==(&vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar6].super_base_blob<256U>,
                         &merkleBlock.vMatchedTxn.
                          super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar6].second.
                          super_base_blob<256U>);
    local_638[0] = (class_property<bool>)(class_property<bool>)bVar4;
    local_630 = (element_type *)0x0;
    sStack_628.pi_ = (sp_counted_base *)0x0;
    local_950._0_8_ = "vMatched[i] == merkleBlock.vMatchedTxn[i].second";
    local_950.m_message.px = (element_type *)0xb7ba89;
    local_728._8_8_ = local_728._8_8_ & 0xffffffffffffff00;
    local_728._0_8_ = &PTR__lazy_ostream_011481f0;
    local_718 = boost::unit_test::lazy_ostream::inst;
    apaStack_710[0] = &local_950;
    pvVar7 = &DAT_00000001;
    pvVar8 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_638,(lazy_ostream *)local_728,1,0,WARN,0xb7b44c,
               (size_t)&stack0xfffffffffffff4e0,0x142);
    boost::detail::shared_count::~shared_count(&sStack_628);
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&vIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base
            (&vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>);
  CMerkleBlock::~CMerkleBlock(&merkleBlock);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&filter);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&stream);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&block.vtx);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(merkle_block_2_with_update_none)
{
    // Random real block (000000005a4ded781e667e06ceefafb71410b511fe0d5adc3e5a27ecbec34ae6)
    // With 4 txes
    CBlock block;
    DataStream stream{
        "0100000075616236cc2126035fadb38deb65b9102cc2c41c09cdf29fc051906800000000fe7d5e12ef0ff901f6050211249919b1c0653771832b3a80c66cea42847f0ae1d4d26e49ffff001d00f0a4410401000000010000000000000000000000000000000000000000000000000000000000000000ffffffff0804ffff001d029105ffffffff0100f2052a010000004341046d8709a041d34357697dfcb30a9d05900a6294078012bf3bb09c6f9b525f1d16d5503d7905db1ada9501446ea00728668fc5719aa80be2fdfc8a858a4dbdd4fbac00000000010000000255605dc6f5c3dc148b6da58442b0b2cd422be385eab2ebea4119ee9c268d28350000000049483045022100aa46504baa86df8a33b1192b1b9367b4d729dc41e389f2c04f3e5c7f0559aae702205e82253a54bf5c4f65b7428551554b2045167d6d206dfe6a2e198127d3f7df1501ffffffff55605dc6f5c3dc148b6da58442b0b2cd422be385eab2ebea4119ee9c268d2835010000004847304402202329484c35fa9d6bb32a55a70c0982f606ce0e3634b69006138683bcd12cbb6602200c28feb1e2555c3210f1dddb299738b4ff8bbe9667b68cb8764b5ac17b7adf0001ffffffff0200e1f505000000004341046a0765b5865641ce08dd39690aade26dfbf5511430ca428a3089261361cef170e3929a68aee3d8d4848b0c5111b0a37b82b86ad559fd2a745b44d8e8d9dfdc0cac00180d8f000000004341044a656f065871a353f216ca26cef8dde2f03e8c16202d2e8ad769f02032cb86a5eb5e56842e92e19141d60a01928f8dd2c875a390f67c1f6c94cfc617c0ea45afac0000000001000000025f9a06d3acdceb56be1bfeaa3e8a25e62d182fa24fefe899d1c17f1dad4c2028000000004847304402205d6058484157235b06028c30736c15613a28bdb768ee628094ca8b0030d4d6eb0220328789c9a2ec27ddaec0ad5ef58efded42e6ea17c2e1ce838f3d6913f5e95db601ffffffff5f9a06d3acdceb56be1bfeaa3e8a25e62d182fa24fefe899d1c17f1dad4c2028010000004a493046022100c45af050d3cea806cedd0ab22520c53ebe63b987b8954146cdca42487b84bdd6022100b9b027716a6b59e640da50a864d6dd8a0ef24c76ce62391fa3eabaf4d2886d2d01ffffffff0200e1f505000000004341046a0765b5865641ce08dd39690aade26dfbf5511430ca428a3089261361cef170e3929a68aee3d8d4848b0c5111b0a37b82b86ad559fd2a745b44d8e8d9dfdc0cac00180d8f000000004341046a0765b5865641ce08dd39690aade26dfbf5511430ca428a3089261361cef170e3929a68aee3d8d4848b0c5111b0a37b82b86ad559fd2a745b44d8e8d9dfdc0cac000000000100000002e2274e5fea1bf29d963914bd301aa63b64daaf8a3e88f119b5046ca5738a0f6b0000000048473044022016e7a727a061ea2254a6c358376aaa617ac537eb836c77d646ebda4c748aac8b0220192ce28bf9f2c06a6467e6531e27648d2b3e2e2bae85159c9242939840295ba501ffffffffe2274e5fea1bf29d963914bd301aa63b64daaf8a3e88f119b5046ca5738a0f6b010000004a493046022100b7a1a755588d4190118936e15cd217d133b0e4a53c3c15924010d5648d8925c9022100aaef031874db2114f2d869ac2de4ae53908fbfea5b2b1862e181626bb9005c9f01ffffffff0200e1f505000000004341044a656f065871a353f216ca26cef8dde2f03e8c16202d2e8ad769f02032cb86a5eb5e56842e92e19141d60a01928f8dd2c875a390f67c1f6c94cfc617c0ea45afac00180d8f000000004341046a0765b5865641ce08dd39690aade26dfbf5511430ca428a3089261361cef170e3929a68aee3d8d4848b0c5111b0a37b82b86ad559fd2a745b44d8e8d9dfdc0cac00000000"_hex,
    };
    stream >> TX_WITH_WITNESS(block);

    CBloomFilter filter(10, 0.000001, 0, BLOOM_UPDATE_NONE);
    // Match the first transaction
    filter.insert(uint256{"e980fe9f792d014e73b95203dc1335c5f9ce19ac537a419e6df5b47aecb93b70"});

    CMerkleBlock merkleBlock(block, filter);
    BOOST_CHECK(merkleBlock.header.GetHash() == block.GetHash());

    BOOST_CHECK(merkleBlock.vMatchedTxn.size() == 1);
    std::pair<unsigned int, uint256> pair = merkleBlock.vMatchedTxn[0];

    BOOST_CHECK(merkleBlock.vMatchedTxn[0].second == uint256{"e980fe9f792d014e73b95203dc1335c5f9ce19ac537a419e6df5b47aecb93b70"});
    BOOST_CHECK(merkleBlock.vMatchedTxn[0].first == 0);

    std::vector<uint256> vMatched;
    std::vector<unsigned int> vIndex;
    BOOST_CHECK(merkleBlock.txn.ExtractMatches(vMatched, vIndex) == block.hashMerkleRoot);
    BOOST_CHECK(vMatched.size() == merkleBlock.vMatchedTxn.size());
    for (unsigned int i = 0; i < vMatched.size(); i++)
        BOOST_CHECK(vMatched[i] == merkleBlock.vMatchedTxn[i].second);

    // Match an output from the second transaction (the pubkey for address 1DZTzaBHUDM7T3QvUKBz4qXMRpkg8jsfB5)
    // This should not match the third transaction though it spends the output matched
    // It will match the fourth transaction, which has another pay-to-pubkey output to the same address
    filter.insert("044a656f065871a353f216ca26cef8dde2f03e8c16202d2e8ad769f02032cb86a5eb5e56842e92e19141d60a01928f8dd2c875a390f67c1f6c94cfc617c0ea45af"_hex_u8);

    merkleBlock = CMerkleBlock(block, filter);
    BOOST_CHECK(merkleBlock.header.GetHash() == block.GetHash());

    BOOST_CHECK(merkleBlock.vMatchedTxn.size() == 3);

    BOOST_CHECK(pair == merkleBlock.vMatchedTxn[0]);

    BOOST_CHECK(merkleBlock.vMatchedTxn[1].second == uint256{"28204cad1d7fc1d199e8ef4fa22f182de6258a3eaafe1bbe56ebdcacd3069a5f"});
    BOOST_CHECK(merkleBlock.vMatchedTxn[1].first == 1);

    BOOST_CHECK(merkleBlock.vMatchedTxn[2].second == uint256{"3c1d7e82342158e4109df2e0b6348b6e84e403d8b4046d7007663ace63cddb23"});
    BOOST_CHECK(merkleBlock.vMatchedTxn[2].first == 3);

    BOOST_CHECK(merkleBlock.txn.ExtractMatches(vMatched, vIndex) == block.hashMerkleRoot);
    BOOST_CHECK(vMatched.size() == merkleBlock.vMatchedTxn.size());
    for (unsigned int i = 0; i < vMatched.size(); i++)
        BOOST_CHECK(vMatched[i] == merkleBlock.vMatchedTxn[i].second);
}